

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t exr_write_header(exr_context_t ctxt)

{
  bool bVar1;
  exr_result_t eVar2;
  uint uVar3;
  int32_t iVar4;
  char *in_RDI;
  exr_priv_part_t curp_1;
  int p_2;
  int32_t ccount;
  exr_priv_part_t curp;
  int p_1;
  exr_attribute_t *pname;
  int p;
  exr_result_t rv;
  int in_stack_0000004c;
  exr_priv_part_t in_stack_00000050;
  exr_context_t in_stack_00000058;
  exr_const_context_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  long lVar5;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar6;
  long in_stack_ffffffffffffffe0;
  exr_result_t local_4;
  
  local_4 = 0;
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffc0);
    if (*in_RDI == '\x01') {
      if (*(int *)(in_RDI + 0xc4) == 0) {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
        local_4 = (**(code **)(in_RDI + 0x40))
                            (in_RDI,6,"No parts defined in file prior to writing data");
      }
      else {
        for (uVar3 = (uint)(*(int *)(in_RDI + 0xc4) < 2); (int)uVar3 < *(int *)(in_RDI + 0xc4);
            uVar3 = uVar3 + 1) {
          in_stack_ffffffffffffffe0 =
               *(long *)(*(long *)(*(long *)(in_RDI + 0x1d8) + (long)(int)uVar3 * 8) + 0x68);
          if (in_stack_ffffffffffffffe0 == 0) {
            internal_exr_unlock(in_stack_ffffffffffffffc0);
            eVar2 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,3,"Part %d missing required name for multi-part file",uVar3);
            return eVar2;
          }
        }
        iVar6 = 0;
        while( true ) {
          bVar1 = false;
          if (local_4 == 0) {
            bVar1 = iVar6 < *(int *)(in_RDI + 0xc4);
          }
          if (!bVar1) break;
          lVar5 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)iVar6 * 8);
          if (*(long *)(lVar5 + 0x20) == 0) {
            internal_exr_unlock(in_stack_ffffffffffffffc0);
            eVar2 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"Part %d is missing channel list",iVar6)
            ;
            return eVar2;
          }
          local_4 = internal_exr_compute_tile_information
                              (in_stack_00000058,in_stack_00000050,in_stack_0000004c);
          if (local_4 != 0) break;
          iVar4 = internal_exr_compute_chunk_offset_size((exr_priv_part_t)ctxt);
          if (iVar4 < 0) {
            internal_exr_unlock(in_stack_ffffffffffffffc0);
            eVar2 = (**(code **)(in_RDI + 0x40))
                              (in_RDI,6,
                               "Invalid part specification computing number of chunks in file");
            return eVar2;
          }
          *(int32_t *)(lVar5 + 0xf4) = iVar4;
          if ((in_RDI[4] != '\0') || (in_RDI[5] != '\0')) {
            internal_exr_unlock(in_stack_ffffffffffffffc0);
            local_4 = exr_attr_set_int((exr_context_t)CONCAT44(local_4,uVar3),
                                       (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                                       (char *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),
                                       (int32_t)((ulong)lVar5 >> 0x20));
            internal_exr_lock(in_stack_ffffffffffffffc0);
            if (local_4 != 0) break;
          }
          local_4 = internal_exr_validate_write_part
                              ((exr_context_t)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                               (exr_priv_part_t)in_stack_ffffffffffffffc0);
          iVar6 = iVar6 + 1;
        }
        in_RDI[0xb0] = '\0';
        in_RDI[0xb1] = '\0';
        in_RDI[0xb2] = '\0';
        in_RDI[0xb3] = '\0';
        in_RDI[0xb4] = '\0';
        in_RDI[0xb5] = '\0';
        in_RDI[0xb6] = '\0';
        in_RDI[0xb7] = '\0';
        if (local_4 == 0) {
          local_4 = internal_exr_write_header((exr_context_t)(ulong)uVar3);
        }
        if (local_4 == 0) {
          *in_RDI = '\x03';
          in_RDI[0xb8] = '\0';
          in_RDI[0xb9] = '\0';
          in_RDI[0xba] = '\0';
          in_RDI[0xbb] = '\0';
          in_RDI[0xbc] = -1;
          in_RDI[0xbd] = -1;
          in_RDI[0xbe] = -1;
          in_RDI[0xbf] = -1;
          in_RDI[0xc0] = '\0';
          in_RDI[0xc1] = '\0';
          in_RDI[0xc2] = '\0';
          in_RDI[0xc3] = '\0';
          for (iVar6 = 0; iVar6 < *(int *)(in_RDI + 0xc4); iVar6 = iVar6 + 1) {
            in_stack_ffffffffffffffc0 =
                 *(exr_const_context_t *)(*(long *)(in_RDI + 0x1d8) + (long)iVar6 * 8);
            (in_stack_ffffffffffffffc0->first_part).dataWindow =
                 *(exr_attribute_t **)(in_RDI + 0xb0);
            *(long *)(in_RDI + 0xb0) =
                 (long)*(int *)((long)&(in_stack_ffffffffffffffc0->first_part).compression + 4) * 8
                 + *(long *)(in_RDI + 0xb0);
          }
        }
        internal_exr_unlock(in_stack_ffffffffffffffc0);
      }
    }
    else {
      internal_exr_unlock(in_stack_ffffffffffffffc0);
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_write_header (exr_context_t ctxt)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    internal_exr_lock (ctxt);

    if (ctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (ctxt->num_parts == 0)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "No parts defined in file prior to writing data"));

    /* add part and set name should have already validated the uniqueness
     * so just ensure the name has been set for multi part files
     */
    for ( int p = ctxt->num_parts > 1 ? 0 : 1; p < ctxt->num_parts; ++p )
    {
        const exr_attribute_t* pname = ctxt->parts[p]->name;
        if (!pname)
        {
            return EXR_UNLOCK_AND_RETURN (
                ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Part %d missing required name for multi-part file",
                    p));
        }
    }

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        exr_priv_part_t curp = ctxt->parts[p];

        int32_t ccount = 0;

        if (!curp->channels)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Part %d is missing channel list",
                p));

        rv = internal_exr_compute_tile_information (ctxt, curp, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curp);
        if (ccount < 0)
            return EXR_UNLOCK_AND_RETURN (
                ctxt->report_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Invalid part specification computing number of chunks in file"));

        curp->chunk_count = ccount;

        if (ctxt->has_nonimage_data || ctxt->is_multipart)
        {
            internal_exr_unlock (ctxt);
            rv = exr_attr_set_int (ctxt, p, EXR_REQ_CHUNK_COUNT_STR, ccount);
            internal_exr_lock (ctxt);
            if (rv != EXR_ERR_SUCCESS) break;
        }

        rv = internal_exr_validate_write_part (ctxt, curp);
    }

    ctxt->output_file_offset = 0;

    if (rv == EXR_ERR_SUCCESS) rv = internal_exr_write_header (ctxt);

    if (rv == EXR_ERR_SUCCESS)
    {
        ctxt->mode               = EXR_CONTEXT_WRITING_DATA;
        ctxt->cur_output_part    = 0;
        ctxt->last_output_chunk  = -1;
        ctxt->output_chunk_count = 0;
        for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
        {
            exr_priv_part_t curp = ctxt->parts[p];

            curp->chunk_table_offset = ctxt->output_file_offset;
            ctxt->output_file_offset +=
                (uint64_t) (curp->chunk_count) * sizeof (uint64_t);
        }
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}